

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

void __thiscall
pbrt::PiecewiseConstant1D::PiecewiseConstant1D
          (PiecewiseConstant1D *this,span<const_float> f,Float min,Float max,Allocator alloc)

{
  float **ppfVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  byte bVar20;
  size_t sVar21;
  size_t sVar22;
  ulong uVar23;
  ushort uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar38 [16];
  undefined1 in_ZMM7 [64];
  Float vb;
  Float local_40;
  Float local_3c;
  Float va;
  undefined4 uStack_34;
  
  auVar38 = in_ZMM7._0_16_;
  auVar37 = in_ZMM4._0_16_;
  sVar21 = f.n;
  local_40 = min;
  local_3c = max;
  _va = alloc.memoryResource;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)this,f.ptr,f.ptr + sVar21,
             (polymorphic_allocator<float> *)&va);
  uVar23 = sVar21 + 1;
  (this->cdf).alloc.memoryResource = alloc.memoryResource;
  (this->cdf).nStored = 0;
  (this->cdf).ptr = (float *)0x0;
  (this->cdf).nAlloc = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->cdf,uVar23);
  ppfVar1 = &(this->cdf).ptr;
  if (uVar23 != 0) {
    memset(*ppfVar1,0,uVar23 * 4);
  }
  (this->cdf).nStored = uVar23;
  this->min = local_40;
  this->max = local_3c;
  this->funcInt = 0.0;
  va = local_3c;
  vb = local_40;
  if (local_3c <= local_40) {
    LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],float&,char_const(&)[4],float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
               ,0x2bd,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])0xa27e04,
               (char (*) [4])0xa27df6,(char (*) [4])0xa27e04,(float *)&va,(char (*) [4])0xa27df6,&vb
              );
  }
  pfVar2 = *ppfVar1;
  *pfVar2 = 0.0;
  if (uVar23 < 2) {
    this->funcInt = pfVar2[sVar21];
  }
  else {
    pfVar3 = (this->func).ptr;
    fVar36 = 0.0;
    sVar22 = 0;
    auVar37 = vcvtusi2ss_avx512f(auVar37,sVar21);
    do {
      va = pfVar3[sVar22];
      vb = 0.0;
      if (va < 0.0) {
        LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
                   ,0x2c2,"Check failed: %s >= %s with %s = %s, %s = %s",
                   (char (*) [12])"func[i - 1]",(char (*) [2])0x621a47,(char (*) [12])"func[i - 1]",
                   (float *)&va,(char (*) [2])0x621a47,(int *)&vb);
      }
      fVar36 = fVar36 + ((local_3c - local_40) * va) / auVar37._0_4_;
      pfVar2[sVar22 + 1] = fVar36;
      sVar22 = sVar22 + 1;
    } while (sVar21 != sVar22);
    fVar36 = pfVar2[sVar21];
    this->funcInt = fVar36;
    if ((fVar36 != 0.0) || (NAN(fVar36))) {
      if (1 < uVar23) {
        sVar22 = 0;
        do {
          pfVar2[sVar22 + 1] = pfVar2[sVar22 + 1] / this->funcInt;
          sVar22 = sVar22 + 1;
        } while (sVar21 != sVar22);
      }
    }
    else if (1 < uVar23) {
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0x100f0e0d0c0b0a09));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar31 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar37 = vcvtusi2ss_avx512f(auVar38,sVar21);
      uVar23 = 0;
      auVar32 = vpbroadcastq_avx512f();
      auVar33 = vbroadcastss_avx512f(auVar37);
      do {
        auVar34 = vpbroadcastq_avx512f();
        auVar25 = vcvtuqq2ps_avx512dq(auVar27);
        auVar27 = vpaddq_avx512f(auVar27,auVar31);
        auVar35 = vporq_avx512f(auVar34,auVar29);
        auVar34 = vporq_avx512f(auVar34,auVar30);
        uVar18 = vpcmpuq_avx512f(auVar34,auVar32,2);
        auVar26 = vcvtuqq2ps_avx512dq(auVar28);
        uVar19 = vpcmpuq_avx512f(auVar35,auVar32,2);
        bVar20 = (byte)uVar19;
        auVar28 = vpaddq_avx512f(auVar28,auVar31);
        uVar24 = CONCAT11(bVar20,(byte)uVar18);
        auVar34 = vinsertf64x4_avx512f(ZEXT3264(auVar26),auVar25,1);
        auVar34 = vdivps_avx512f(auVar34,auVar33);
        pfVar3 = pfVar2 + uVar23 + 1;
        bVar4 = (bool)((byte)uVar18 & 1);
        bVar5 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar11 = (bool)((byte)(uVar24 >> 7) & 1);
        bVar12 = (bool)(bVar20 >> 1 & 1);
        bVar13 = (bool)(bVar20 >> 2 & 1);
        bVar14 = (bool)(bVar20 >> 3 & 1);
        bVar15 = (bool)(bVar20 >> 4 & 1);
        bVar16 = (bool)(bVar20 >> 5 & 1);
        bVar17 = (bool)(bVar20 >> 6 & 1);
        *pfVar3 = (float)((uint)bVar4 * auVar34._0_4_ | (uint)!bVar4 * (int)*pfVar3);
        pfVar3[1] = (float)((uint)bVar5 * auVar34._4_4_ | (uint)!bVar5 * (int)pfVar3[1]);
        pfVar3[2] = (float)((uint)bVar6 * auVar34._8_4_ | (uint)!bVar6 * (int)pfVar3[2]);
        pfVar3[3] = (float)((uint)bVar7 * auVar34._12_4_ | (uint)!bVar7 * (int)pfVar3[3]);
        pfVar3[4] = (float)((uint)bVar8 * auVar34._16_4_ | (uint)!bVar8 * (int)pfVar3[4]);
        pfVar3[5] = (float)((uint)bVar9 * auVar34._20_4_ | (uint)!bVar9 * (int)pfVar3[5]);
        pfVar3[6] = (float)((uint)bVar10 * auVar34._24_4_ | (uint)!bVar10 * (int)pfVar3[6]);
        pfVar3[7] = (float)((uint)bVar11 * auVar34._28_4_ | (uint)!bVar11 * (int)pfVar3[7]);
        pfVar3[8] = (float)((uint)(bVar20 & 1) * auVar34._32_4_ |
                           (uint)!(bool)(bVar20 & 1) * (int)pfVar3[8]);
        pfVar3[9] = (float)((uint)bVar12 * auVar34._36_4_ | (uint)!bVar12 * (int)pfVar3[9]);
        pfVar3[10] = (float)((uint)bVar13 * auVar34._40_4_ | (uint)!bVar13 * (int)pfVar3[10]);
        pfVar3[0xb] = (float)((uint)bVar14 * auVar34._44_4_ | (uint)!bVar14 * (int)pfVar3[0xb]);
        pfVar3[0xc] = (float)((uint)bVar15 * auVar34._48_4_ | (uint)!bVar15 * (int)pfVar3[0xc]);
        pfVar3[0xd] = (float)((uint)bVar16 * auVar34._52_4_ | (uint)!bVar16 * (int)pfVar3[0xd]);
        pfVar3[0xe] = (float)((uint)bVar17 * auVar34._56_4_ | (uint)!bVar17 * (int)pfVar3[0xe]);
        pfVar3[0xf] = (float)((uint)(bVar20 >> 7) * auVar34._60_4_ |
                             (uint)!(bool)(bVar20 >> 7) * (int)pfVar3[0xf]);
        uVar23 = uVar23 + 0x10;
      } while ((sVar21 + 0xf & 0xfffffffffffffff0) != uVar23);
    }
  }
  return;
}

Assistant:

PiecewiseConstant1D(pstd::span<const Float> f, Float min, Float max,
                        Allocator alloc = {})
        : func(f.begin(), f.end(), alloc), cdf(f.size() + 1, alloc), min(min), max(max) {
        CHECK_GT(max, min);
        // Compute integral of step function at $x_i$
        cdf[0] = 0;
        size_t n = f.size();
        for (size_t i = 1; i < n + 1; ++i) {
            CHECK_GE(func[i - 1], 0);
            cdf[i] = cdf[i - 1] + func[i - 1] * (max - min) / n;
        }

        // Transform step function integral into CDF
        funcInt = cdf[n];
        if (funcInt == 0)
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] = Float(i) / Float(n);
        else
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] /= funcInt;
    }